

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_KillSiblings
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 inflictor_00;
  PClassActor *filter_00;
  int flags_00;
  VMValue *pVVar1;
  AActor *source_00;
  TObjPtr<AActor> *this;
  AActor *pAVar2;
  bool bVar3;
  bool local_93;
  FName local_90;
  FName local_8c;
  AActor *local_88;
  AActor *mo;
  TThinkerIterator<AActor> it;
  AActor *inflictor;
  AActor *source;
  int local_50;
  int inflict;
  int src;
  FName species;
  MetaClass *filter;
  int flags;
  FName damagetype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x17fa,
                  "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    _flags = (AActor *)(param->field_0).field_1.a;
    local_93 = true;
    if (_flags != (AActor *)0x0) {
      local_93 = DObject::IsKindOf((DObject *)_flags,AActor::RegistrationInfo.MyClass);
    }
    if (local_93 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x17fa,
                    "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    FName::FName((FName *)((long)&filter + 4));
    if (numparam < 2) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fb,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      FName::operator=((FName *)((long)&filter + 4),(pVVar1->field_0).i);
    }
    else {
      if (param[1].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fb,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::operator=((FName *)((long)&filter + 4),param[1].field_0.i);
    }
    if (numparam < 3) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fc,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      filter._0_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fc,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter._0_4_ = param[2].field_0.i;
    }
    if (numparam < 4) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      bVar3 = false;
      if ((pVVar1->field_0).field_3.Type == '\x03') {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
        bVar3 = true;
        if ((pVVar1->field_0).field_1.atag != 1) {
          pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
          bVar3 = (pVVar1->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar3) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fd,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      _src = (PClassActor *)(pVVar1->field_0).field_1.a;
    }
    else {
      bVar3 = false;
      if ((param[3].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, param[3].field_0.field_1.atag != 1)) {
        bVar3 = param[3].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fd,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      _src = (PClassActor *)param[3].field_0.field_1.a;
    }
    FName::FName((FName *)&inflict);
    if (numparam < 5) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fe,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      FName::operator=((FName *)&inflict,(pVVar1->field_0).i);
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17fe,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::operator=((FName *)&inflict,param[4].field_0.i);
    }
    if (numparam < 6) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17ff,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
      local_50 = (pVVar1->field_0).i;
    }
    else {
      if (param[5].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x17ff,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      local_50 = param[5].field_0.i;
    }
    if (numparam < 7) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1800,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
      source._4_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[6].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1800,
                      "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      source._4_4_ = param[6].field_0.i;
    }
    source_00 = COPY_AAPTR(_flags,local_50);
    it.super_FThinkerIterator._16_8_ = COPY_AAPTR(_flags,source._4_4_);
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mo,0x80);
    bVar3 = TObjPtr<AActor>::operator!=(&_flags->master,(AActor *)0x0);
    if (bVar3) {
      while (local_88 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mo,false),
            local_88 != (AActor *)0x0) {
        this = &local_88->master;
        pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&_flags->master);
        bVar3 = TObjPtr<AActor>::operator==(this,pAVar2);
        inflictor_00 = it.super_FThinkerIterator._16_8_;
        pAVar2 = local_88;
        if ((bVar3) && (local_88 != _flags)) {
          FName::FName(&local_8c,(FName *)((long)&filter + 4));
          flags_00 = (int)filter;
          filter_00 = _src;
          FName::FName(&local_90,(FName *)&inflict);
          DoKill(pAVar2,(AActor *)inflictor_00,source_00,&local_8c,flags_00,filter_00,&local_90);
        }
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x17fa,
                "int AF_AActor_A_KillSiblings(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KillSiblings)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME_DEF	(damagetype)	
	PARAM_INT_DEF	(flags)			
	PARAM_CLASS_DEF	(filter, AActor)
	PARAM_NAME_DEF	(species)		
	PARAM_INT_DEF	(src)			
	PARAM_INT_DEF	(inflict)		

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	if (self->master != NULL)
	{
		while ( (mo = it.Next()) )
		{
			if (mo->master == self->master && mo != self)
			{ 
				DoKill(mo, inflictor, source, damagetype, flags, filter, species);
			}
		}
	}
	return 0;
}